

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::ICUDataTable::get
          (ICUDataTable *this,char *tableKey,char *subTableKey,char *itemKey,UnicodeString *result)

{
  UChar *srcChars;
  UnicodeString *pUVar1;
  int32_t len;
  UErrorCode status;
  UnicodeString local_60;
  
  status = U_ZERO_ERROR;
  len = 0;
  srcChars = uloc_getTableStringWithFallback_63
                       (this->path,(this->locale).fullName,tableKey,subTableKey,itemKey,&len,&status
                       );
  if (len < 1 || U_ZERO_ERROR < status) {
    UnicodeString::UnicodeString(&local_60,itemKey,-1,kInvariant);
    pUVar1 = UnicodeString::setTo(result,&local_60);
    UnicodeString::~UnicodeString(&local_60);
  }
  else {
    pUVar1 = UnicodeString::setTo(result,srcChars,len);
  }
  return pUVar1;
}

Assistant:

UnicodeString &
ICUDataTable::get(const char* tableKey, const char* subTableKey, const char* itemKey,
                  UnicodeString &result) const {
  UErrorCode status = U_ZERO_ERROR;
  int32_t len = 0;

  const UChar *s = uloc_getTableStringWithFallback(path, locale.getName(),
                                                   tableKey, subTableKey, itemKey,
                                                   &len, &status);
  if (U_SUCCESS(status) && len > 0) {
    return result.setTo(s, len);
  }
  return result.setTo(UnicodeString(itemKey, -1, US_INV));
}